

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

void cl_send_cb(uv_udp_send_t *req,int status)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar1 = "req != NULL";
    uStack_10 = 0x3b;
  }
  else if (status == 0) {
    if (req->handle == &client || req->handle == &server) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return;
    }
    pcVar1 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
    uStack_10 = 0x3d;
  }
  else {
    pcVar1 = "status == 0";
    uStack_10 = 0x3c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-immediate.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);
  if (++cl_send_cb_called == 1) {
    uv_udp_connect(&client, NULL);
    r = uv_udp_send(req, &client, &buf, 1, NULL, cl_send_cb);
    ASSERT(r == UV_EDESTADDRREQ);
    r = uv_udp_send(req,
                    &client,
                    &buf,
                    1,
                    (const struct sockaddr*) &lo_addr,
                    cl_send_cb);
    ASSERT(r == 0);
  }

}